

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O3

void spvtools::opt::anon_unknown_15::MakeSetClosedSSA
               (IRContext *context,Function *function,
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *blocks,unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                       *exit_bb,LCSSARewriter *lcssa_rewriter)

{
  CFG *this;
  DefUseManager *this_00;
  Instruction *def;
  IRContext *this_01;
  DefUseManager *this_02;
  bool bVar1;
  DominatorTree *this_03;
  _Hash_node_base *p_Var2;
  BasicBlock *A;
  const_iterator __begin2;
  _Hash_node_base *p_Var3;
  Instruction *inst;
  __node_base _Var4;
  __node_base _Var5;
  UseRewriter rewriter;
  _Any_data local_d0;
  code *local_c0;
  code *local_b8;
  LCSSARewriter *local_b0;
  Instruction *local_a8;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_a0;
  _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  if ((context->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(context);
  }
  this = (context->cfg_)._M_t.
         super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t.
         super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
         super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  this_03 = (DominatorTree *)IRContext::GetDominatorAnalysis(context,function);
  if ((context->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(context);
  }
  p_Var2 = (blocks->_M_h)._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    this_00 = (context->def_use_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    do {
      A = CFG::block(this,*(uint32_t *)&p_Var2[1]._M_nxt);
      p_Var3 = (exit_bb->_M_h)._M_before_begin._M_nxt;
      if (p_Var3 != (_Hash_node_base *)0x0) {
LAB_0024d0cd:
        bVar1 = DominatorTree::Dominates(this_03,A,(BasicBlock *)p_Var3[1]._M_nxt);
        if (!bVar1) goto code_r0x0024d0e2;
        for (def = (A->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                   super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
            def != &(A->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
            def = (def->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
          local_a0._M_buckets = &local_a0._M_single_bucket;
          local_a0._M_bucket_count = 1;
          local_a0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_a0._M_element_count = 0;
          local_a0._M_rehash_policy._M_max_load_factor = 1.0;
          local_a0._M_rehash_policy._M_next_resize = 0;
          local_a0._M_single_bucket = (__node_base_ptr)0x0;
          local_68._M_buckets = &local_68._M_single_bucket;
          local_68._M_bucket_count = 1;
          local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_68._M_element_count = 0;
          local_68._M_rehash_policy._M_max_load_factor = 1.0;
          local_68._M_rehash_policy._M_next_resize = 0;
          local_68._M_single_bucket = (__node_base_ptr)0x0;
          local_d0._8_8_ = 0;
          local_b0 = lcssa_rewriter;
          local_a8 = def;
          local_d0._M_unused._M_object = operator_new(0x20);
          *(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            **)local_d0._M_unused._0_8_ = blocks;
          *(LCSSARewriter ***)((long)local_d0._M_unused._0_8_ + 8) = &local_b0;
          *(unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
            **)((long)local_d0._M_unused._0_8_ + 0x10) = exit_bb;
          *(IRContext **)((long)local_d0._M_unused._0_8_ + 0x18) = context;
          local_b8 = std::
                     _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_utils.cpp:289:18)>
                     ::_M_invoke;
          local_c0 = std::
                     _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_utils.cpp:289:18)>
                     ::_M_manager;
          analysis::DefUseManager::ForEachUse
                    (this_00,def,
                     (function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)&local_d0);
          if (local_c0 != (code *)0x0) {
            (*local_c0)(&local_d0,&local_d0,__destroy_functor);
          }
          this_01 = local_b0->context_;
          if ((this_01->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
            IRContext::BuildDefUseManager(this_01);
          }
          if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
            this_02 = (this_01->def_use_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                      _M_head_impl;
            _Var4._M_nxt = local_68._M_before_begin._M_nxt;
            do {
              analysis::DefUseManager::AnalyzeInstDef(this_02,(Instruction *)_Var4._M_nxt[1]._M_nxt)
              ;
              _Var4._M_nxt = (_Var4._M_nxt)->_M_nxt;
              _Var5._M_nxt = local_68._M_before_begin._M_nxt;
            } while (_Var4._M_nxt != (_Hash_node_base *)0x0);
            for (; _Var5._M_nxt != (_Hash_node_base *)0x0; _Var5._M_nxt = (_Var5._M_nxt)->_M_nxt) {
              analysis::DefUseManager::AnalyzeInstUse(this_02,(Instruction *)_Var5._M_nxt[1]._M_nxt)
              ;
            }
          }
          std::
          _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable(&local_68);
          std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(&local_a0);
        }
      }
LAB_0024d26f:
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  return;
code_r0x0024d0e2:
  p_Var3 = p_Var3->_M_nxt;
  if (p_Var3 == (_Hash_node_base *)0x0) goto LAB_0024d26f;
  goto LAB_0024d0cd;
}

Assistant:

inline void MakeSetClosedSSA(IRContext* context, Function* function,
                             const std::unordered_set<uint32_t>& blocks,
                             const std::unordered_set<BasicBlock*>& exit_bb,
                             LCSSARewriter* lcssa_rewriter) {
  CFG& cfg = *context->cfg();
  DominatorTree& dom_tree =
      context->GetDominatorAnalysis(function)->GetDomTree();
  analysis::DefUseManager* def_use_manager = context->get_def_use_mgr();

  for (uint32_t bb_id : blocks) {
    BasicBlock* bb = cfg.block(bb_id);
    // If bb does not dominate an exit block, then it cannot have escaping defs.
    if (!DominatesAnExit(bb, exit_bb, dom_tree)) continue;
    for (Instruction& inst : *bb) {
      LCSSARewriter::UseRewriter rewriter(lcssa_rewriter, inst);
      def_use_manager->ForEachUse(
          &inst, [&blocks, &rewriter, &exit_bb, context](
                     Instruction* use, uint32_t operand_index) {
            BasicBlock* use_parent = context->get_instr_block(use);
            assert(use_parent);
            if (blocks.count(use_parent->id())) return;

            if (use->opcode() == spv::Op::OpPhi) {
              // If the use is a Phi instruction and the incoming block is
              // coming from the loop, then that's consistent with LCSSA form.
              if (exit_bb.count(use_parent)) {
                return;
              } else {
                // That's not an exit block, but the user is a phi instruction.
                // Consider the incoming branch only.
                use_parent = context->get_instr_block(
                    use->GetSingleWordOperand(operand_index + 1));
              }
            }
            // Rewrite the use. Note that this call does not invalidate the
            // def/use manager. So this operation is safe.
            rewriter.RewriteUse(use_parent, use, operand_index);
          });
      rewriter.UpdateManagers();
    }
  }
}